

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ships.cpp
# Opt level: O1

bool val_positioning(Board *board,int row,int col,Ship ship)

{
  Ship ship_00;
  Ship ship_01;
  bool bVar1;
  undefined8 in_stack_00000008;
  
  if ((char)ship.sRow == 'V') {
    ship_01._8_8_ = ship._0_8_;
    ship_01._0_8_ = in_stack_00000008;
    ship_01.orientation = 0x56;
    ship_01._17_7_ = ship._9_7_;
    bVar1 = aux_positioning_vertical(board,row,col,ship_01);
    return bVar1;
  }
  if ((char)ship.sRow == 'H') {
    ship_00._8_8_ = ship._0_8_;
    ship_00._0_8_ = in_stack_00000008;
    ship_00.orientation = 0x48;
    ship_00._17_7_ = ship._9_7_;
    bVar1 = aux_positioning_horizontal(board,row,col,ship_00);
    return bVar1;
  }
  return false;
}

Assistant:

bool val_positioning( Board *board, int row, int col, Ship ship )
{
    bool control = false;

    if( ship.orientation == 'H' )
    {
        control = aux_positioning_horizontal( board, row, col, ship );
    }

    else if( ship.orientation == 'V' )
    {
        control = aux_positioning_vertical( board, row, col, ship );
    }

    return control;
}